

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O2

int __thiscall
anon_unknown.dwarf_38a::NinjaMain::ToolRules(NinjaMain *this,Options *options,int argc,char **argv)

{
  Rule *this_00;
  bool bVar1;
  int iVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
  *pmVar3;
  EvalString *this_01;
  _Base_ptr p_Var4;
  bool bVar5;
  allocator<char> local_51;
  string local_50;
  
  _optind = 1;
  bVar1 = false;
  do {
    bVar5 = bVar1;
    iVar2 = getopt(argc + 1,argv + -1,"hd");
    bVar1 = true;
  } while (iVar2 == 100);
  if (iVar2 == -1) {
    pmVar3 = BindingEnv::GetRules_abi_cxx11_(&(this->state_).bindings_);
    for (p_Var4 = (pmVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(pmVar3->_M_t)._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      printf("%s",*(undefined8 *)(p_Var4 + 1));
      if (bVar5) {
        this_00 = *(Rule **)(p_Var4 + 2);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"description",&local_51);
        this_01 = Rule::GetBinding(this_00,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        if (this_01 != (EvalString *)0x0) {
          EvalString::Unparse_abi_cxx11_(&local_50,this_01);
          printf(": %s",local_50._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&local_50);
        }
      }
      putchar(10);
    }
    iVar2 = 0;
  }
  else {
    puts(
        "usage: ninja -t rules [options]\n\noptions:\n  -d     also print the description of the rule\n  -h     print this message"
        );
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int NinjaMain::ToolRules(const Options* options, int argc, char* argv[]) {
  // Parse options.

  // The rules tool uses getopt, and expects argv[0] to contain the name of
  // the tool, i.e. "rules".
  argc++;
  argv--;

  bool print_description = false;

  optind = 1;
  int opt;
  while ((opt = getopt(argc, argv, const_cast<char*>("hd"))) != -1) {
    switch (opt) {
    case 'd':
      print_description = true;
      break;
    case 'h':
    default:
      printf("usage: ninja -t rules [options]\n"
             "\n"
             "options:\n"
             "  -d     also print the description of the rule\n"
             "  -h     print this message\n"
             );
    return 1;
    }
  }
  argv += optind;
  argc -= optind;

  // Print rules

  typedef map<string, const Rule*> Rules;
  const Rules& rules = state_.bindings_.GetRules();
  for (Rules::const_iterator i = rules.begin(); i != rules.end(); ++i) {
    printf("%s", i->first.c_str());
    if (print_description) {
      const Rule* rule = i->second;
      const EvalString* description = rule->GetBinding("description");
      if (description != NULL) {
        printf(": %s", description->Unparse().c_str());
      }
    }
    printf("\n");
  }
  return 0;
}